

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::translatePrint(Builder *this,FuncCallExpr *print)

{
  allocator<std::shared_ptr<mocker::ast::Expression>_> *this_00;
  BuilderContext *id;
  initializer_list<std::shared_ptr<mocker::ast::Expression>_> __l;
  initializer_list<std::shared_ptr<mocker::ast::Expression>_> __l_00;
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  element_type *peVar4;
  __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *node;
  ASTNode *this_01;
  char *pcVar6;
  element_type *peVar7;
  element_type *peVar8;
  shared_ptr<mocker::ast::Expression> *local_1c8;
  shared_ptr<mocker::ast::Expression> *local_1a0;
  allocator<std::shared_ptr<mocker::ast::Expression>_> local_151;
  shared_ptr<mocker::ast::Expression> local_150;
  shared_ptr<mocker::ast::Expression> local_140;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  local_130;
  char *local_118;
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  shared_ptr<mocker::ast::FuncCallExpr> printRhs;
  shared_ptr<mocker::ast::Expression> local_e0;
  shared_ptr<mocker::ast::Expression> local_d0;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  local_c0;
  undefined1 local_a8 [24];
  undefined1 local_90 [8];
  shared_ptr<mocker::ast::FuncCallExpr> printLhs;
  shared_ptr<mocker::ast::BinaryExpr> concat;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Addr> arg;
  undefined1 local_50 [8];
  shared_ptr<mocker::ast::FuncCallExpr> toString;
  undefined1 local_28 [7];
  bool newline;
  value_type val;
  FuncCallExpr *print_local;
  Builder *this_local;
  
  val.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)print;
  pvVar3 = std::
           vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
           ::at(&print->args,0);
  std::shared_ptr<mocker::ast::Expression>::shared_ptr
            ((shared_ptr<mocker::ast::Expression> *)local_28,pvVar3);
  peVar4 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&val.
                          super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._M_use_count);
  bVar1 = std::operator==(&peVar4->val,"println");
  std::dynamic_pointer_cast<mocker::ast::FuncCallExpr,mocker::ast::Expression>
            ((shared_ptr<mocker::ast::Expression> *)local_50);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (bVar2) {
    peVar8 = std::
             __shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    peVar4 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar8->identifier);
    bVar2 = std::operator!=(&peVar4->val,"toString");
    if (!bVar2) {
      peVar8 = std::
               __shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      p_Var5 = (__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ::at(&peVar8->args,0);
      node = std::
             __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(p_Var5);
      visit<mocker::ast::Expression>(this,node);
      id = this->ctx;
      peVar8 = std::
               __shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      p_Var5 = (__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ::at(&peVar8->args,0);
      this_01 = &std::
                 __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5)->super_ASTNode;
      ast::ASTNode::getID(this_01);
      BuilderContext::getExprAddr((BuilderContext *)local_68,(NodeID)id);
      pcVar6 = "_printInt";
      if (bVar1) {
        pcVar6 = "_printlnInt";
      }
      concat.super___shared_ptr<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar6;
      BuilderContext::emplaceInst<mocker::ir::Call,char_const*,std::shared_ptr<mocker::ir::Addr>&>
                (this->ctx,
                 (char **)&concat.
                           super___shared_ptr<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(shared_ptr<mocker::ir::Addr> *)local_68);
      arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           1;
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_68);
      goto LAB_001a521e;
    }
  }
  arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 3;
LAB_001a521e:
  std::shared_ptr<mocker::ast::FuncCallExpr>::~shared_ptr
            ((shared_ptr<mocker::ast::FuncCallExpr> *)local_50);
  if (arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 3) {
    std::dynamic_pointer_cast<mocker::ast::BinaryExpr,mocker::ast::Expression>
              ((shared_ptr<mocker::ast::Expression> *)
               &printLhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &printLhs.
                        super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if ((bVar2) &&
       (peVar7 = std::
                 __shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&printLhs.
                                  super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), peVar7->op == Add)) {
      local_a8._16_8_ = (pointer)0x0;
      std::make_shared<mocker::ast::Identifier,char_const(&)[6]>((char (*) [6])local_a8);
      peVar7 = std::
               __shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&printLhs.
                                super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      std::shared_ptr<mocker::ast::Expression>::shared_ptr(&local_e0,&peVar7->lhs);
      local_d0.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      this_00 = (allocator<std::shared_ptr<mocker::ast::Expression>_> *)
                ((long)&printRhs.
                        super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      local_d0.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_e0;
      std::allocator<std::shared_ptr<mocker::ast::Expression>_>::allocator(this_00);
      __l_00._M_len =
           (size_type)
           local_d0.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      __l_00._M_array =
           (iterator)
           local_d0.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::vector(&local_c0,__l_00,this_00);
      std::
      make_shared<mocker::ast::FuncCallExpr,decltype(nullptr),std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                ((void **)local_90,(shared_ptr<mocker::ast::Identifier> *)(local_a8 + 0x10),
                 (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)local_a8);
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::~vector(&local_c0);
      std::allocator<std::shared_ptr<mocker::ast::Expression>_>::~allocator
                ((allocator<std::shared_ptr<mocker::ast::Expression>_> *)
                 ((long)&printRhs.
                         super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      local_1a0 = &local_d0;
      do {
        local_1a0 = local_1a0 + -1;
        std::shared_ptr<mocker::ast::Expression>::~shared_ptr(local_1a0);
      } while (local_1a0 != &local_e0);
      std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
                ((shared_ptr<mocker::ast::Identifier> *)local_a8);
      peVar8 = std::
               __shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_90);
      translatePrint(this,peVar8);
      local_110._16_8_ = (pointer)0x0;
      local_118 = "print";
      if (bVar1) {
        local_118 = "println";
      }
      std::make_shared<mocker::ast::Identifier,char_const*>((char **)local_110);
      peVar7 = std::
               __shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::BinaryExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&printLhs.
                                super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      std::shared_ptr<mocker::ast::Expression>::shared_ptr(&local_150,&peVar7->rhs);
      local_140.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_140.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_150;
      std::allocator<std::shared_ptr<mocker::ast::Expression>_>::allocator(&local_151);
      __l._M_len = (size_type)
                   local_140.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
      __l._M_array = (iterator)
                     local_140.
                     super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::vector(&local_130,__l,&local_151);
      std::
      make_shared<mocker::ast::FuncCallExpr,decltype(nullptr),std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                ((void **)local_f8,(shared_ptr<mocker::ast::Identifier> *)(local_110 + 0x10),
                 (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  *)local_110);
      std::
      vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
      ::~vector(&local_130);
      std::allocator<std::shared_ptr<mocker::ast::Expression>_>::~allocator(&local_151);
      local_1c8 = &local_140;
      do {
        local_1c8 = local_1c8 + -1;
        std::shared_ptr<mocker::ast::Expression>::~shared_ptr(local_1c8);
      } while (local_1c8 != &local_150);
      std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
                ((shared_ptr<mocker::ast::Identifier> *)local_110);
      peVar8 = std::
               __shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_f8);
      translatePrint(this,peVar8);
      arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           1;
      std::shared_ptr<mocker::ast::FuncCallExpr>::~shared_ptr
                ((shared_ptr<mocker::ast::FuncCallExpr> *)local_f8);
      std::shared_ptr<mocker::ast::FuncCallExpr>::~shared_ptr
                ((shared_ptr<mocker::ast::FuncCallExpr> *)local_90);
    }
    else {
      arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           5;
    }
    std::shared_ptr<mocker::ast::BinaryExpr>::~shared_ptr
              ((shared_ptr<mocker::ast::BinaryExpr> *)
               &printLhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        == 5) {
      translateCall(this,(FuncCallExpr *)
                         val.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
      arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           0;
    }
  }
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr
            ((shared_ptr<mocker::ast::Expression> *)local_28);
  return;
}

Assistant:

void Builder::translatePrint(const ast::FuncCallExpr &print) const {
  auto val = print.args.at(0);
  bool newline = (print.identifier->val == "println");

  // can be converted to printInt ?
  while (true) {
    auto toString = std::dynamic_pointer_cast<ast::FuncCallExpr>(val);
    if (!toString || toString->identifier->val != "toString")
      break;
    visit(*toString->args.at(0));
    auto arg = ctx.getExprAddr(toString->args.at(0)->getID());
    ctx.emplaceInst<Call>(newline ? "_printlnInt" : "_printInt", arg);
    return;
  }

  // can be split into two print's ?
  while (true) {
    auto concat = std::dynamic_pointer_cast<ast::BinaryExpr>(val);
    if (!concat || concat->op != ast::BinaryExpr::Add)
      break;
    auto printLhs = std::make_shared<ast::FuncCallExpr>(
        nullptr, std::make_shared<ast::Identifier>("print"),
        std::vector<std::shared_ptr<ast::Expression>>{concat->lhs});
    translatePrint(*printLhs);
    auto printRhs = std::make_shared<ast::FuncCallExpr>(
        nullptr,
        std::make_shared<ast::Identifier>(newline ? "println" : "print"),
        std::vector<std::shared_ptr<ast::Expression>>{concat->rhs});
    translatePrint(*printRhs);
    return;
  }

  translateCall(print);
}